

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# performance_counters.cpp
# Opt level: O0

counters * __thiscall libtorrent::counters::operator=(counters *this,counters *c)

{
  __int_type _Var1;
  long lVar2;
  value_type *pvVar3;
  value_type *pvVar4;
  int local_5c;
  int i;
  counters *c_local;
  counters *this_local;
  memory_order __b_1;
  memory_order __b;
  
  if (c != this) {
    for (local_5c = 0;
        lVar2 = libtorrent::aux::
                container_wrapper<std::atomic<long>,_long,_std::array<std::atomic<long>,_291UL>_>::
                end_index(&this->m_stats_counter), local_5c < lVar2; local_5c = local_5c + 1) {
      pvVar3 = libtorrent::aux::
               container_wrapper<std::atomic<long>,_long,_std::array<std::atomic<long>,_291UL>_>::
               operator[](&this->m_stats_counter,(long)local_5c);
      pvVar4 = libtorrent::aux::
               container_wrapper<std::atomic<long>,_long,_std::array<std::atomic<long>,_291UL>_>::
               operator[](&c->m_stats_counter,(long)local_5c);
      ::std::operator&(memory_order_relaxed,__memory_order_mask);
      _Var1 = (pvVar4->super___atomic_base<long>)._M_i;
      ::std::operator&(memory_order_relaxed,__memory_order_mask);
      (pvVar3->super___atomic_base<long>)._M_i = _Var1;
    }
  }
  return this;
}

Assistant:

counters& counters::operator=(counters const& c) & TORRENT_COUNTER_NOEXCEPT
	{
		if (&c == this) return *this;
#ifdef ATOMIC_LLONG_LOCK_FREE
		for (int i = 0; i < m_stats_counter.end_index(); ++i)
			m_stats_counter[i].store(
				c.m_stats_counter[i].load(std::memory_order_relaxed)
					, std::memory_order_relaxed);
#else
		std::lock_guard<std::mutex> l(m_mutex);
		std::lock_guard<std::mutex> l2(c.m_mutex);
		m_stats_counter = c.m_stats_counter;
#endif
		return *this;
	}